

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_ManGetClpStats_rec(Cba_Ntk_t *p,int *pCountN,int *pCountI,int *pCountO)

{
  int iVar1;
  int iVar2;
  Cba_ObjType_t CVar3;
  int iVar4;
  int iVar5;
  Cba_Ntk_t *p_00;
  int NtkId;
  int Id;
  int iObj;
  int *pCountO_local;
  int *pCountI_local;
  int *pCountN_local;
  Cba_Ntk_t *p_local;
  
  iVar1 = Cba_NtkId(p);
  if (pCountN[iVar1] < 0) {
    pCountO[iVar1] = 0;
    pCountI[iVar1] = 0;
    pCountN[iVar1] = 0;
    for (NtkId = 1; iVar2 = Vec_StrSize(&p->vObjType), NtkId < iVar2; NtkId = NtkId + 1) {
      CVar3 = Cba_ObjType(p,NtkId);
      if (CVar3 != CBA_OBJ_NONE) {
        iVar2 = Cba_ObjIsBoxPrim(p,NtkId);
        if (iVar2 == 0) {
          iVar2 = Cba_ObjIsBoxUser(p,NtkId);
          if (iVar2 != 0) {
            iVar4 = Cba_ObjNtkId(p,NtkId);
            p_00 = Cba_ObjNtk(p,NtkId);
            Cba_ManGetClpStats_rec(p_00,pCountN,pCountI,pCountO);
            iVar2 = pCountN[iVar4];
            iVar5 = Cba_ObjFonNum(p,NtkId);
            pCountN[iVar1] = iVar2 + iVar5 + pCountN[iVar1];
            iVar2 = pCountI[iVar4];
            iVar5 = Cba_ObjFonNum(p,NtkId);
            pCountI[iVar1] = iVar2 + iVar5 + pCountI[iVar1];
            iVar2 = pCountO[iVar4];
            iVar4 = Cba_ObjFonNum(p,NtkId);
            pCountO[iVar1] = iVar2 + iVar4 + pCountO[iVar1];
          }
        }
        else {
          pCountN[iVar1] = pCountN[iVar1] + 1;
          iVar2 = Cba_ObjFinNum(p,NtkId);
          pCountI[iVar1] = iVar2 + pCountI[iVar1];
          iVar2 = Cba_ObjFonNum(p,NtkId);
          pCountO[iVar1] = iVar2 + pCountO[iVar1];
        }
      }
    }
  }
  return;
}

Assistant:

void Cba_ManGetClpStats_rec( Cba_Ntk_t * p, int * pCountN, int * pCountI, int * pCountO )
{
    int iObj, Id = Cba_NtkId(p);
    if ( pCountN[Id] >= 0 )
        return;
    pCountN[Id] = pCountI[Id] = pCountO[Id] = 0;
    Cba_NtkForEachObj( p, iObj )
        if ( Cba_ObjIsBoxPrim(p, iObj) )
        {
            pCountN[Id] += 1;
            pCountI[Id] += Cba_ObjFinNum(p, iObj);
            pCountO[Id] += Cba_ObjFonNum(p, iObj);
        }
        else if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            int NtkId = Cba_ObjNtkId(p, iObj);
            Cba_ManGetClpStats_rec( Cba_ObjNtk(p, iObj), pCountN, pCountI, pCountO );
            pCountN[Id] += pCountN[NtkId] + Cba_ObjFonNum(p, iObj);
            pCountI[Id] += pCountI[NtkId] + Cba_ObjFonNum(p, iObj);
            pCountO[Id] += pCountO[NtkId] + Cba_ObjFonNum(p, iObj);
        }
}